

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::__decodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t *length,
          uint32_t *out,size_t nvalue)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint32_t *out_00;
  uint32_t uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  pointer puVar7;
  __m128i *in_00;
  uint uVar8;
  size_t cap;
  size_t local_38;
  
  uVar6 = (ulong)*in;
  puVar5 = (uint32_t *)((long)in + ((ulong)in[uVar6] + 3 & 0xfffffffffffffffc) + 4 + uVar6 * 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->datatobepacked,
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  out_00 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)out_00 >> 2;
  puVar5 = Simple8b<true>::decodeArray
                     (&this->ecoder,puVar5,(long)((long)in + (*length * 4 - (long)puVar5)) >> 2,
                      out_00,&local_38);
  *length = (long)puVar5 - (long)in >> 2;
  if (0x7f < nvalue) {
    puVar5 = in + uVar6 + 1;
    puVar7 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    in_00 = (__m128i *)(in + 1);
    uVar6 = 0;
    do {
      bVar1 = (byte)*puVar5;
      bVar2 = *(byte *)((long)puVar5 + 1);
      uVar8 = (uint)bVar2;
      puVar5 = (uint32_t *)((long)puVar5 + 2);
      usimdunpack(in_00,out,(uint)bVar1);
      if (bVar2 != 0) {
        do {
          uVar4 = *puVar5;
          puVar5 = (uint32_t *)((long)puVar5 + 1);
          uVar3 = *puVar7;
          puVar7 = puVar7 + 1;
          out[(byte)uVar4] = out[(byte)uVar4] | uVar3 << (bVar1 & 0x1f);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      in_00 = in_00 + bVar1;
      uVar6 = (ulong)((int)uVar6 + 1);
      out = out + 0x80;
    } while (uVar6 < nvalue >> 7);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    datatobepacked.resize(datatobepacked.capacity());
    size_t cap = datatobepacked.size();
    size_t le = initin + length - inexcept;
    inexcept = ecoder.decodeArray(inexcept, le, &datatobepacked[0], cap);

    length = inexcept - initin;

    auto exceptionsptr = datatobepacked.begin();
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      // in = unpackblock<BlockSize>(in, out, b);
      assert(BlockSize == 128);
      usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
      in += BlockSizeInUnitsOfPackSize * b;
      for (uint32_t k = 0; k < cexcept; ++k) {
        const uint8_t pos = *(bytep++);
        out[pos] |= (*(exceptionsptr++)) << b;
      }
    }
    assert(in == headerin + wheremeta);
  }